

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

void __thiscall ymfm::ym2612::generate(ym2612 *this,output_data *output,uint32_t numsamples)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  uint32_t uVar4;
  ymfm_output<2> *output_00;
  opn_registers_base<true> *poVar5;
  int local_58;
  int local_54;
  int local_30;
  int32_t dacval;
  int chan;
  int last_fm_channel;
  output_data temp;
  uint32_t samp;
  uint32_t numsamples_local;
  output_data *output_local;
  ym2612 *this_local;
  
  temp.data[1] = numsamples;
  _samp = output;
  for (temp.data[0] = 0; (uint)temp.data[0] < (uint)temp.data[1]; temp.data[0] = temp.data[0] + 1) {
    fm_engine_base<ymfm::opn_registers_base<true>_>::clock
              ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
    ymfm_output<2>::clear(_samp);
    iVar1 = 6;
    if (this->m_dac_enable != '\0') {
      iVar1 = 5;
    }
    for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
      output_00 = ymfm_output<2>::clear((ymfm_output<2> *)&chan);
      fm_engine_base<ymfm::opn_registers_base<true>_>::output
                ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,output_00,5,0x100,
                 1 << ((byte)local_30 & 0x1f));
      iVar2 = dac_discontinuity(chan);
      iVar3 = fm_engine_base<ymfm::opn_registers_base<true>_>::get_pan_l
                        ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,
                         (uint16_t)local_30);
      _samp->data[0] = (iVar2 * iVar3) / 0xffff + _samp->data[0];
      iVar2 = dac_discontinuity(last_fm_channel);
      iVar3 = fm_engine_base<ymfm::opn_registers_base<true>_>::get_pan_r
                        ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,
                         (uint16_t)local_30);
      _samp->data[1] = (iVar2 * iVar3) / 0xffff + _samp->data[1];
    }
    if (this->m_dac_enable != '\0') {
      local_58 = dac_discontinuity((int)(short)(this->m_dac_data << 7) >> 7);
      poVar5 = fm_engine_base<ymfm::opn_registers_base<true>_>::regs
                         ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
      uVar4 = opn_registers_base<true>::ch_output_0(poVar5,0x102);
      local_54 = local_58;
      if (uVar4 == 0) {
        local_54 = dac_discontinuity(0);
      }
      _samp->data[0] = local_54 + _samp->data[0];
      poVar5 = fm_engine_base<ymfm::opn_registers_base<true>_>::regs
                         ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
      uVar4 = opn_registers_base<true>::ch_output_1(poVar5,0x102);
      if (uVar4 == 0) {
        local_58 = dac_discontinuity(0);
      }
      _samp->data[1] = local_58 + _samp->data[1];
    }
    _samp->data[0] = (_samp->data[0] << 0xd) / 0x186;
    _samp->data[1] = (_samp->data[1] << 0xd) / 0x186;
    _samp = _samp + 1;
  }
  return;
}

Assistant:

void ym2612::generate(output_data *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		// clock the system
		m_fm.clock(fm_engine::ALL_CHANNELS);

		// sum individual channels to apply DAC discontinuity on each
		output->clear();
		output_data temp;

		// first do FM-only channels; OPN2 is 9-bit with intermediate clipping
		int const last_fm_channel = m_dac_enable ? 5 : 6;
		for (int chan = 0; chan < last_fm_channel; chan++)
		{
			m_fm.output(temp.clear(), 5, 256, 1 << chan);
			output->data[0] += (dac_discontinuity(temp.data[0]) * m_fm.get_pan_l(chan) / 65535);
			output->data[1] += (dac_discontinuity(temp.data[1]) * m_fm.get_pan_r(chan) / 65535);
		}

		// add in DAC
		if (m_dac_enable)
		{
			// DAC enabled: start with DAC value then add the first 5 channels only
			int32_t dacval = dac_discontinuity(int16_t(m_dac_data << 7) >> 7);
			output->data[0] += m_fm.regs().ch_output_0(0x102) ? dacval : dac_discontinuity(0);
			output->data[1] += m_fm.regs().ch_output_1(0x102) ? dacval : dac_discontinuity(0);
		}

		// output is technically multiplexed rather than mixed, but that requires
		// a better sound mixer than we usually have, so just average over the six
		// channels; also apply a 64/65 factor to account for the discontinuity
		// adjustment above
		output->data[0] = (output->data[0] * 128) * 64 / (6 * 65);
		output->data[1] = (output->data[1] * 128) * 64 / (6 * 65);
	}
}